

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_cmp_cint(MDB_val *a,MDB_val *b)

{
  bool bVar1;
  int iVar2;
  long lStack_28;
  int x;
  unsigned_short *c;
  unsigned_short *u;
  MDB_val *b_local;
  MDB_val *a_local;
  
  lStack_28 = (long)b->mv_data + a->mv_size;
  c = (unsigned_short *)((long)a->mv_data + a->mv_size);
  do {
    iVar2 = (uint)c[-1] - (uint)*(ushort *)(lStack_28 + -2);
    bVar1 = false;
    if (iVar2 == 0) {
      bVar1 = a->mv_data < c + -1;
    }
    lStack_28 = lStack_28 + -2;
    c = c + -1;
  } while (bVar1);
  return iVar2;
}

Assistant:

static int
mdb_cmp_cint(const MDB_val *a, const MDB_val *b)
{
#if BYTE_ORDER == LITTLE_ENDIAN
	unsigned short *u, *c;
	int x;

	u = (unsigned short *) ((char *) a->mv_data + a->mv_size);
	c = (unsigned short *) ((char *) b->mv_data + a->mv_size);
	do {
		x = *--u - *--c;
	} while(!x && u > (unsigned short *)a->mv_data);
	return x;
#else
	unsigned short *u, *c, *end;
	int x;

	end = (unsigned short *) ((char *) a->mv_data + a->mv_size);
	u = (unsigned short *)a->mv_data;
	c = (unsigned short *)b->mv_data;
	do {
		x = *u++ - *c++;
	} while(!x && u < end);
	return x;
#endif
}